

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

void __thiscall Cleaner::PrintHeader(Cleaner *this)

{
  bool bVar1;
  Cleaner *this_local;
  
  if (this->config_->verbosity != QUIET) {
    printf("Cleaning...");
    bVar1 = IsVerbose(this);
    if (bVar1) {
      printf("\n");
    }
    else {
      printf(" ");
    }
    fflush(_stdout);
  }
  return;
}

Assistant:

void Cleaner::PrintHeader() {
  if (config_.verbosity == BuildConfig::QUIET)
    return;
  printf("Cleaning...");
  if (IsVerbose())
    printf("\n");
  else
    printf(" ");
  fflush(stdout);
}